

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error appendAttributeValue
                    (XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                    STRING_POOL *pool)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  XML_Error XVar6;
  XML_Char *pXVar7;
  NAMED *pNVar8;
  ulong uVar9;
  byte bVar10;
  char *next;
  XML_Char buf [4];
  XML_Error local_64;
  char *local_58;
  int local_50;
  char local_4c [4];
  char *local_48;
  HASH_TABLE *local_40;
  STRING_POOL *local_38;
  
  local_38 = (STRING_POOL *)((long)parser + 0x448);
  local_40 = (HASH_TABLE *)((long)parser + 0x290);
  do {
    iVar3 = (*enc->literalScanners[0])(enc,ptr,end,&local_58);
    bVar10 = 1;
    switch(iVar3) {
    case 0:
      local_64 = XML_ERROR_INVALID_TOKEN;
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = local_58;
      }
      break;
    case 6:
      pXVar7 = poolAppend(pool,enc,ptr,local_58);
      if (pXVar7 == (XML_Char *)0x0) goto LAB_001514d4;
      goto LAB_001515e8;
    case 7:
      goto switchD_001512ea_caseD_7;
    case 9:
      iVar3 = (*enc->predefinedEntityName)
                        (enc,ptr + enc->minBytesPerChar,local_58 + -(long)enc->minBytesPerChar);
      if ((char)iVar3 == '\0') {
        pXVar7 = poolStoreString(local_38,enc,ptr + enc->minBytesPerChar,
                                 local_58 + -(long)enc->minBytesPerChar);
        bVar10 = 1;
        if (pXVar7 == (XML_Char *)0x0) goto LAB_00151577;
        pNVar8 = lookup(local_40,pXVar7,0);
        *(undefined8 *)((long)parser + 0x460) = *(undefined8 *)((long)parser + 0x468);
        if (pNVar8 == (NAMED *)0x0) {
          if (*(int *)((long)parser + 0x360) == 0) {
            bVar10 = 0;
          }
          else {
            local_64 = XML_ERROR_UNDEFINED_ENTITY;
            if (*(ENCODING **)((long)parser + 0x118) == enc) {
              *(char **)((long)parser + 0x218) = ptr;
            }
          }
        }
        else {
          if (*(char *)&pNVar8[7].name == '\0') {
            if (pNVar8[6].name == (KEY)0x0) {
              pcVar2 = pNVar8[1].name;
              if (pcVar2 != (char *)0x0) {
                *(undefined1 *)&pNVar8[7].name = 1;
                XVar6 = appendAttributeValue
                                  (parser,*(ENCODING **)((long)parser + 0x1b8),isCdata,pcVar2,
                                   pcVar2 + *(int *)&pNVar8[2].name,pool);
                *(undefined1 *)&pNVar8[7].name = 0;
                bVar10 = XVar6 != XML_ERROR_NONE;
                if ((bool)bVar10) {
                  local_64 = XVar6;
                }
                goto LAB_001515e2;
              }
              local_64 = XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
            }
            else {
              local_64 = XML_ERROR_BINARY_ENTITY_REF;
            }
          }
          else {
            local_64 = XML_ERROR_RECURSIVE_ENTITY_REF;
          }
          if (*(ENCODING **)((long)parser + 0x118) == enc) {
            *(char **)((long)parser + 0x218) = ptr;
          }
        }
      }
      else if ((pool->ptr == pool->end) && (iVar5 = poolGrow(pool), iVar5 == 0)) {
LAB_00151577:
        bVar10 = 1;
        local_64 = XML_ERROR_NO_MEMORY;
      }
      else {
        pcVar2 = pool->ptr;
        pool->ptr = pcVar2 + 1;
        *pcVar2 = (char)iVar3;
        bVar10 = 4;
      }
      goto LAB_001515e2;
    case 10:
      iVar3 = (*enc->charRefNumber)(enc,ptr);
      if (-1 < iVar3) {
        if ((isCdata == 0) && (iVar3 == 0x20)) {
          bVar10 = 4;
          if ((pool->ptr == pool->start) || (pool->ptr[-1] == ' ')) goto LAB_001515e2;
        }
        uVar4 = cm_expat_XmlUtf8Encode(iVar3,local_4c);
        if (uVar4 != 0) {
          bVar10 = 0;
          if (0 < (int)uVar4) {
            local_48 = end;
            uVar9 = 0;
            local_50 = isCdata;
            do {
              if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
                bVar10 = 1;
                local_64 = XML_ERROR_NO_MEMORY;
                end = local_48;
                isCdata = local_50;
                break;
              }
              cVar1 = local_4c[uVar9];
              pcVar2 = pool->ptr;
              pool->ptr = pcVar2 + 1;
              *pcVar2 = cVar1;
              uVar9 = uVar9 + 1;
              end = local_48;
              isCdata = local_50;
            } while (uVar4 != uVar9);
          }
          goto LAB_001515e2;
        }
      }
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = ptr;
      }
      local_64 = XML_ERROR_BAD_CHAR_REF;
      bVar10 = 1;
LAB_001515e2:
      if ((bVar10 & 3) != 0) break;
      goto LAB_001515e8;
    case -4:
      local_64 = XML_ERROR_NONE;
      break;
    case -3:
      local_58 = ptr + enc->minBytesPerChar;
      goto switchD_001512ea_caseD_7;
    case -2:
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 8:
switchD_001512ea_caseD_fffffffe:
      local_64 = XML_ERROR_UNEXPECTED_STATE;
      goto LAB_0015149a;
    case -1:
      local_64 = XML_ERROR_INVALID_TOKEN;
LAB_0015149a:
      if (*(ENCODING **)((long)parser + 0x118) == enc) {
        *(char **)((long)parser + 0x218) = ptr;
      }
      break;
    default:
      if (iVar3 != 0x27) goto switchD_001512ea_caseD_fffffffe;
switchD_001512ea_caseD_7:
      if ((isCdata != 0) || ((pool->ptr != pool->start && (pool->ptr[-1] != ' ')))) {
        if ((pool->ptr == pool->end) && (iVar3 = poolGrow(pool), iVar3 == 0)) {
LAB_001514d4:
          bVar10 = 1;
          local_64 = XML_ERROR_NO_MEMORY;
          break;
        }
        pXVar7 = pool->ptr;
        pool->ptr = pXVar7 + 1;
        *pXVar7 = ' ';
      }
LAB_001515e8:
      bVar10 = 0;
      ptr = local_58;
    }
    if (bVar10 != 0) {
      return local_64;
    }
  } while( true );
}

Assistant:

static enum XML_Error
appendAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                     const char *ptr, const char *end,
                     STRING_POOL *pool)
{
  for (;;) {
    const char *next;
    int tok = XmlAttributeValueTok(enc, ptr, end, &next);
    switch (tok) {
    case XML_TOK_NONE:
      return XML_ERROR_NONE;
    case XML_TOK_INVALID:
      if (enc == encoding)
        eventPtr = next;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_PARTIAL:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_INVALID_TOKEN;
    case XML_TOK_CHAR_REF:
      {
        XML_Char buf[XML_ENCODE_MAX];
        int i;
        int n = XmlCharRefNumber(enc, ptr);
        if (n < 0) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        if (!isCdata
            && n == 0x20 /* space */
            && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
          break;
        n = XmlEncode(n, (ICHAR *)buf);
        if (!n) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BAD_CHAR_REF;
        }
        for (i = 0; i < n; i++) {
          if (!poolAppendChar(pool, buf[i]))
            return XML_ERROR_NO_MEMORY;
        }
      }
      break;
    case XML_TOK_DATA_CHARS:
      if (!poolAppend(pool, enc, ptr, next))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_TRAILING_CR:
      next = ptr + enc->minBytesPerChar;
      /* fall through */
    case XML_TOK_ATTRIBUTE_VALUE_S:
    case XML_TOK_DATA_NEWLINE:
      if (!isCdata && (poolLength(pool) == 0 || poolLastChar(pool) == 0x20))
        break;
      if (!poolAppendChar(pool, 0x20))
        return XML_ERROR_NO_MEMORY;
      break;
    case XML_TOK_ENTITY_REF:
      {
        const XML_Char *name;
        ENTITY *entity;
        XML_Char ch = XmlPredefinedEntityName(enc,
                                              ptr + enc->minBytesPerChar,
                                              next - enc->minBytesPerChar);
        if (ch) {
          if (!poolAppendChar(pool, ch))
            return XML_ERROR_NO_MEMORY;
          break;
        }
        name = poolStoreString(&temp2Pool, enc,
                               ptr + enc->minBytesPerChar,
                               next - enc->minBytesPerChar);
        if (!name)
          return XML_ERROR_NO_MEMORY;
        entity = (ENTITY *)lookup(&dtd.generalEntities, name, 0);
        poolDiscard(&temp2Pool);
        if (!entity) {
          if (dtd.complete) {
            if (enc == encoding)
              eventPtr = ptr;
            return XML_ERROR_UNDEFINED_ENTITY;
          }
        }
        else if (entity->open) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_RECURSIVE_ENTITY_REF;
        }
        else if (entity->notation) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_BINARY_ENTITY_REF;
        }
        else if (!entity->textPtr) {
          if (enc == encoding)
            eventPtr = ptr;
          return XML_ERROR_ATTRIBUTE_EXTERNAL_ENTITY_REF;
        }
        else {
          enum XML_Error result;
          const XML_Char *textEnd = entity->textPtr + entity->textLen;
          entity->open = 1;
          result = appendAttributeValue(parser, internalEncoding, isCdata, (char *)entity->textPtr, (char *)textEnd, pool);
          entity->open = 0;
          if (result)
            return result;
        }
      }
      break;
    default:
      if (enc == encoding)
        eventPtr = ptr;
      return XML_ERROR_UNEXPECTED_STATE;
    }
    ptr = next;
  }
  /* not reached */
}